

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O0

int run_test_loop_instant_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x44,"0 == uv_loop_init(&loop)");
    abort();
  }
  iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                        loop_instant_close_work_cb,loop_instant_close_after_work_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x48,
            "0 == uv_queue_work(&loop, &req, loop_instant_close_work_cb, loop_instant_close_after_work_cb)"
           );
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x49,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_instant_close) {
  static uv_loop_t loop;
  static uv_work_t req;
  ASSERT(0 == uv_loop_init(&loop));
  ASSERT(0 == uv_queue_work(&loop,
                            &req,
                            loop_instant_close_work_cb,
                            loop_instant_close_after_work_cb));
  MAKE_VALGRIND_HAPPY();
  return 0;
}